

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeCube>::ComputeSolutionHDivT<std::complex<double>>
          (TPZCompElHDiv<pzshape::TPZShapeCube> *this,TPZMaterialDataT<std::complex<double>_> *data)

{
  int iVar1;
  long *plVar2;
  TPZCompMesh *pTVar3;
  TPZManVector<std::complex<double>,_10> *pTVar4;
  TPZFNMatrix<30,_std::complex<double>_> *pTVar5;
  int64_t iVar6;
  int64_t iVar7;
  int64_t iVar8;
  TPZFNMatrix<9,_double> *pTVar9;
  Fad<double> *pFVar10;
  double *pdVar11;
  TPZGeoEl *pTVar12;
  TPZConnect *this_00;
  complex<double> *pcVar13;
  long in_RSI;
  long *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  TPZFMatrix<Fad<double>_> *row;
  TPZFMatrix<Fad<double>_> *pTVar14;
  int kdim;
  int ilinha;
  int i_2;
  TPZManVector<double,_3> normal;
  REAL phival;
  complex<double> meshsol;
  int idf;
  int64_t is_1;
  int ish;
  int64_t pos;
  int dfvar;
  int64_t dfseq;
  TPZConnect *df;
  int in;
  int nshapeV;
  int counter;
  int ivec;
  int ishape;
  TPZBlock *block;
  int j;
  int i_1;
  int s_1;
  int gel_dim;
  TPZGeoEl *ref;
  TPZFNMatrix<4,_double> Grad0;
  int s;
  int e;
  int i;
  TPZManVector<TPZFNMatrix<9,_double>,_18> GradNormalvec;
  TPZFNMatrix<3,_double> Normalvec;
  int normvecCols;
  int normvecRows;
  TPZFMatrix<std::complex<double>_> GradOfPhiHdiv;
  int64_t is;
  int64_t numbersol;
  TPZFMatrix<std::complex<double>_> *MeshSol;
  int ncon;
  int nstate;
  int dim;
  TPZFMatrix<double> *in_stack_ffffffffffffeb38;
  TPZSolutionMatrix *in_stack_ffffffffffffeb40;
  TPZCompEl *in_stack_ffffffffffffeb48;
  TPZManVector<TPZFNMatrix<9,_double>,_18> *in_stack_ffffffffffffeb50;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffeb58;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffeb60;
  double *in_stack_ffffffffffffeb68;
  int64_t in_stack_ffffffffffffeb70;
  int64_t in_stack_ffffffffffffeb78;
  TPZFNMatrix<4,_double> *in_stack_ffffffffffffeb80;
  complex<double> *in_stack_ffffffffffffeb88;
  TPZVec<std::complex<double>_> *in_stack_ffffffffffffeb90;
  int64_t in_stack_ffffffffffffeba0;
  double dVar15;
  int64_t in_stack_ffffffffffffeba8;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffebb0;
  int64_t in_stack_ffffffffffffebd8;
  undefined4 in_stack_ffffffffffffebe0;
  undefined4 in_stack_ffffffffffffebe4;
  int64_t in_stack_ffffffffffffec08;
  TPZManVector<TPZFNMatrix<30,_std::complex<double>_>,_20> *in_stack_ffffffffffffec10;
  int local_1364;
  int local_1344;
  int local_132c;
  TPZVec<double> local_1328;
  double local_12f0;
  undefined8 local_12e8;
  TPZCompEl *in_stack_ffffffffffffed20;
  int local_12d4;
  long local_12d0;
  int local_12c4;
  int local_129c;
  int local_1290;
  int local_1280;
  int local_127c;
  int local_1278;
  int local_11a4;
  int local_11a0;
  int local_119c;
  TPZVec<TPZFNMatrix<9,_double>_> local_1198 [7];
  size_t in_stack_ffffffffffffef58;
  char *in_stack_ffffffffffffef60;
  complex<double> local_58;
  complex<double> local_48;
  int64_t local_38;
  int64_t local_30;
  TPZFMatrix<std::complex<double>_> *local_28;
  int local_1c;
  int local_18;
  undefined4 local_14;
  long local_10;
  
  local_14 = 3;
  local_10 = in_RSI;
  plVar2 = (long *)(**(code **)(*in_RDI + 0xb8))();
  local_18 = (**(code **)(*plVar2 + 0x78))();
  local_1c = (**(code **)(*in_RDI + 0x90))();
  pTVar3 = TPZCompEl::Mesh(in_stack_ffffffffffffed20);
  TPZCompMesh::Solution(pTVar3);
  local_28 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_ffffffffffffeb40);
  local_30 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_28);
  if (local_30 != 1) {
    pzinternal::DebugStopImpl(in_stack_ffffffffffffef60,in_stack_ffffffffffffef58);
  }
  TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::Resize
            ((TPZManVector<TPZManVector<std::complex<double>,_10>,_20> *)in_stack_ffffffffffffec10,
             in_stack_ffffffffffffec08);
  TPZManVector<TPZFNMatrix<30,_std::complex<double>_>,_20>::Resize
            (in_stack_ffffffffffffec10,in_stack_ffffffffffffec08);
  TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::Resize
            ((TPZManVector<TPZManVector<std::complex<double>,_10>,_20> *)in_stack_ffffffffffffec10,
             in_stack_ffffffffffffec08);
  for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
    pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
                       ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)(local_10 + 0x48d0),
                        local_38);
    (*(pTVar4->super_TPZVec<std::complex<double>_>)._vptr_TPZVec[3])(pTVar4,(long)(local_18 * 3));
    TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
              ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)(local_10 + 0x48d0),local_38);
    std::complex<double>::complex(&local_48,0.0,0.0);
    TPZVec<std::complex<double>_>::Fill
              (in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               (int64_t)in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
    pTVar5 = TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>::operator[]
                       ((TPZVec<TPZFNMatrix<30,_std::complex<double>_>_> *)(local_10 + 0x57f0),
                        local_38);
    (*(pTVar5->super_TPZFMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>.
      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])(pTVar5,(long)(local_18 * 3),3);
    pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
                       ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)(local_10 + 0x8a10),
                        local_38);
    (*(pTVar4->super_TPZVec<std::complex<double>_>)._vptr_TPZVec[3])(pTVar4,(long)local_18);
    TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
              ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)(local_10 + 0x8a10),local_38);
    std::complex<double>::complex(&local_58,0.0,0.0);
    TPZVec<std::complex<double>_>::Fill
              (in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               (int64_t)in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  }
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
  TPZFMatrix<std::complex<double>_>::Zero
            ((TPZFMatrix<std::complex<double>_> *)in_stack_ffffffffffffeb40);
  iVar6 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(local_10 + 0x4420));
  iVar7 = TPZBaseMatrix::Cols((TPZBaseMatrix *)(local_10 + 0x4420));
  TPZFNMatrix<3,_double>::TPZFNMatrix
            ((TPZFNMatrix<3,_double> *)in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
             in_stack_ffffffffffffeb70,in_stack_ffffffffffffeb68);
  TPZManVector<TPZFNMatrix<9,_double>,_18>::TPZManVector
            ((TPZManVector<TPZFNMatrix<9,_double>,_18> *)
             CONCAT44(in_stack_ffffffffffffebe4,in_stack_ffffffffffffebe0),in_stack_ffffffffffffebd8
            );
  local_119c = 0;
  while( true ) {
    iVar8 = TPZVec<TPZFNMatrix<9,_double>_>::size(local_1198);
    if (iVar8 <= local_119c) break;
    pTVar9 = TPZVec<TPZFNMatrix<9,_double>_>::operator[](local_1198,(long)local_119c);
    (*(pTVar9->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0xe])(pTVar9,3);
    local_119c = local_119c + 1;
  }
  if ((*(byte *)(local_10 + 0x38fc) & 1) == 0) {
    TPZFNMatrix<3,_double>::operator=
              ((TPZFNMatrix<3,_double> *)in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
  }
  else {
    pzinternal::DebugStopImpl(in_stack_ffffffffffffef60,in_stack_ffffffffffffef58);
    for (local_11a0 = 0; local_11a0 < (int)iVar6; local_11a0 = local_11a0 + 1) {
      for (local_11a4 = 0; local_11a4 < (int)iVar7; local_11a4 = local_11a4 + 1) {
        pFVar10 = TPZFMatrix<Fad<double>_>::operator()
                            (in_stack_ffffffffffffeb60,(int64_t)in_stack_ffffffffffffeb58,
                             (int64_t)in_stack_ffffffffffffeb50);
        pdVar11 = Fad<double>::val(pFVar10);
        dVar15 = *pdVar11;
        pdVar11 = TPZFMatrix<double>::operator()
                            ((TPZFMatrix<double> *)in_stack_ffffffffffffeb60,
                             (int64_t)in_stack_ffffffffffffeb58,(int64_t)in_stack_ffffffffffffeb50);
        *pdVar11 = dVar15;
      }
    }
    TPZFNMatrix<4,_double>::TPZFNMatrix
              (in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70,
               in_stack_ffffffffffffeb68);
    pTVar12 = TPZCompEl::Reference(in_stack_ffffffffffffeb48);
    iVar1 = (**(code **)(*(long *)pTVar12 + 0x210))();
    for (local_1278 = 0; local_1278 < (int)iVar7; local_1278 = local_1278 + 1) {
      for (local_127c = 0; local_127c < iVar1; local_127c = local_127c + 1) {
        for (local_1280 = 0; local_1280 < iVar1; local_1280 = local_1280 + 1) {
          TPZFMatrix<Fad<double>_>::operator()
                    (in_stack_ffffffffffffeb60,(int64_t)in_stack_ffffffffffffeb58,
                     (int64_t)in_stack_ffffffffffffeb50);
          pdVar11 = Fad<double>::fastAccessDx
                              ((Fad<double> *)in_stack_ffffffffffffeb40,
                               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20));
          dVar15 = *pdVar11;
          pdVar11 = TPZFMatrix<double>::operator()
                              ((TPZFMatrix<double> *)in_stack_ffffffffffffeb60,
                               (int64_t)in_stack_ffffffffffffeb58,(int64_t)in_stack_ffffffffffffeb50
                              );
          *pdVar11 = dVar15;
        }
      }
      TPZVec<TPZFNMatrix<9,_double>_>::operator[](local_1198,(long)local_1278);
      TPZFNMatrix<9,_double>::operator=
                ((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
    }
    TPZFNMatrix<4,_double>::~TPZFNMatrix((TPZFNMatrix<4,_double> *)0x1a210e8);
  }
  pTVar3 = TPZCompEl::Mesh(in_stack_ffffffffffffed20);
  TPZCompMesh::Block(pTVar3);
  local_1290 = 0;
  TPZVec<std::pair<int,_long>_>::NElements((TPZVec<std::pair<int,_long>_> *)(local_10 + 0x42c0));
  for (local_129c = 0; local_129c < local_1c; local_129c = local_129c + 1) {
    this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_129c);
    TPZConnect::SequenceNumber(this_00);
    iVar1 = TPZBlock::Size((TPZBlock *)in_stack_ffffffffffffeb40,
                           (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20));
    TPZBlock::Position((TPZBlock *)in_stack_ffffffffffffeb40,
                       (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20));
    local_12c4 = 0;
    while( true ) {
      if (iVar1 / local_18 <= local_12c4) break;
      for (local_12d0 = 0; local_12d0 < local_30; local_12d0 = local_12d0 + 1) {
        for (local_12d4 = 0; local_12d4 < local_18; local_12d4 = local_12d4 + 1) {
          pcVar13 = TPZFMatrix<std::complex<double>_>::operator()
                              ((TPZFMatrix<std::complex<double>_> *)in_stack_ffffffffffffeb60,
                               (int64_t)in_stack_ffffffffffffeb58,(int64_t)in_stack_ffffffffffffeb50
                              );
          local_12e8 = *(undefined8 *)pcVar13->_M_value;
          pdVar11 = TPZFMatrix<double>::operator()
                              ((TPZFMatrix<double> *)in_stack_ffffffffffffeb60,
                               (int64_t)in_stack_ffffffffffffeb58,(int64_t)in_stack_ffffffffffffeb50
                              );
          local_12f0 = *pdVar11;
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffeb60,
                     (int64_t)in_stack_ffffffffffffeb58);
          for (local_132c = 0; local_132c < 3; local_132c = local_132c + 1) {
            if ((*(byte *)(local_10 + 0x38fc) & 1) == 0) {
              pdVar11 = TPZFMatrix<double>::operator()
                                  ((TPZFMatrix<double> *)in_stack_ffffffffffffeb60,
                                   (int64_t)in_stack_ffffffffffffeb58,
                                   (int64_t)in_stack_ffffffffffffeb50);
              dVar15 = *pdVar11;
              pdVar11 = TPZVec<double>::operator[](&local_1328,(long)local_132c);
              *pdVar11 = dVar15;
            }
            else {
              pFVar10 = TPZFMatrix<Fad<double>_>::operator()
                                  (in_stack_ffffffffffffeb60,(int64_t)in_stack_ffffffffffffeb58,
                                   (int64_t)in_stack_ffffffffffffeb50);
              pdVar11 = Fad<double>::val(pFVar10);
              dVar15 = *pdVar11;
              pdVar11 = TPZVec<double>::operator[](&local_1328,(long)local_132c);
              *pdVar11 = dVar15;
            }
          }
          TPZFMatrix<double>::operator()
                    ((TPZFMatrix<double> *)in_stack_ffffffffffffeb60,
                     (int64_t)in_stack_ffffffffffffeb58,(int64_t)in_stack_ffffffffffffeb50);
          std::operator*((double *)in_stack_ffffffffffffeb38,(complex<double> *)0x1a214da);
          pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
                             ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)(local_10 + 0x8a10)
                              ,local_12d0);
          TPZVec<std::complex<double>_>::operator[]
                    (&pTVar4->super_TPZVec<std::complex<double>_>,(long)local_12d4);
          std::complex<double>::operator+=
                    ((complex<double> *)in_stack_ffffffffffffeb40,
                     (complex<double> *)in_stack_ffffffffffffeb38);
          for (local_1344 = 0; local_1344 < 3; local_1344 = local_1344 + 1) {
            TPZVec<double>::operator[](&local_1328,(long)local_1344);
            std::operator*((double *)in_stack_ffffffffffffeb38,(complex<double> *)0x1a215ad);
            row = (TPZFMatrix<Fad<double>_> *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
            pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
                               ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)
                                (local_10 + 0x48d0),local_12d0);
            TPZVec<std::complex<double>_>::operator[]
                      (&pTVar4->super_TPZVec<std::complex<double>_>,
                       (long)(local_1344 + local_12d4 * 3));
            std::complex<double>::operator+=
                      ((complex<double> *)in_stack_ffffffffffffeb40,
                       (complex<double> *)in_stack_ffffffffffffeb38);
            for (local_1364 = 0; local_1364 < 3; local_1364 = local_1364 + 1) {
              TPZFMatrix<std::complex<double>_>::operator()
                        ((TPZFMatrix<std::complex<double>_> *)in_stack_ffffffffffffeb60,
                         (int64_t)in_stack_ffffffffffffeb58,(int64_t)in_stack_ffffffffffffeb50);
              std::operator*((complex<double> *)in_stack_ffffffffffffeb38,
                             (complex<double> *)0x1a21676);
              pTVar14 = (TPZFMatrix<Fad<double>_> *)
                        CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
              in_stack_ffffffffffffeb60 = pTVar14;
              TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>::operator[]
                        ((TPZVec<TPZFNMatrix<30,_std::complex<double>_>_> *)(local_10 + 0x57f0),
                         local_12d0);
              in_stack_ffffffffffffeb50 =
                   (TPZManVector<TPZFNMatrix<9,_double>,_18> *)
                   TPZFMatrix<std::complex<double>_>::operator()
                             ((TPZFMatrix<std::complex<double>_> *)in_stack_ffffffffffffeb60,
                              (int64_t)row,(int64_t)in_stack_ffffffffffffeb50);
              std::complex<double>::operator+=
                        ((complex<double> *)in_stack_ffffffffffffeb40,
                         (complex<double> *)in_stack_ffffffffffffeb38);
              in_stack_ffffffffffffeb58 = row;
              if ((*(byte *)(local_10 + 0x38fc) & 1) != 0) {
                TPZVec<TPZFNMatrix<9,_double>_>::operator[](local_1198,(long)local_1290);
                TPZFMatrix<double>::operator()
                          ((TPZFMatrix<double> *)in_stack_ffffffffffffeb60,(int64_t)row,
                           (int64_t)in_stack_ffffffffffffeb50);
                std::operator*((complex<double> *)in_stack_ffffffffffffeb38,(double *)0x1a2175c);
                in_stack_ffffffffffffeb40 =
                     (TPZSolutionMatrix *)
                     TPZFMatrix<double>::operator()
                               ((TPZFMatrix<double> *)in_stack_ffffffffffffeb60,(int64_t)row,
                                (int64_t)in_stack_ffffffffffffeb50);
                std::operator*((complex<double> *)in_stack_ffffffffffffeb38,(double *)0x1a217a7);
                TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>::operator[]
                          ((TPZVec<TPZFNMatrix<30,_std::complex<double>_>_> *)(local_10 + 0x57f0),
                           local_12d0);
                in_stack_ffffffffffffeb38 =
                     (TPZFMatrix<double> *)
                     TPZFMatrix<std::complex<double>_>::operator()
                               ((TPZFMatrix<std::complex<double>_> *)in_stack_ffffffffffffeb60,
                                (int64_t)row,(int64_t)in_stack_ffffffffffffeb50);
                std::complex<double>::operator+=
                          ((complex<double> *)in_stack_ffffffffffffeb40,
                           (complex<double> *)in_stack_ffffffffffffeb38);
                in_stack_ffffffffffffeb58 = row;
              }
              row = pTVar14;
            }
          }
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffeb40);
        }
      }
      local_1290 = local_1290 + 1;
      local_12c4 = local_12c4 + 1;
    }
  }
  TPZManVector<TPZFNMatrix<9,_double>,_18>::~TPZManVector(in_stack_ffffffffffffeb50);
  TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x1a21901);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1a2190e);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::ComputeSolutionHDivT(TPZMaterialDataT<TVar> &data)
{
    
    const int dim = 3; // Hdiv vectors are always in R3
    const int nstate = this->Material()->NStateVariables();
    const int ncon = this->NConnects();

    TPZFMatrix<TVar> &MeshSol = this->Mesh()->Solution();

    int64_t numbersol = MeshSol.Cols();

    if(numbersol != 1)
    {
        DebugStop();
    }
    data.sol.Resize(numbersol);
    data.dsol.Resize(numbersol);
    data.divsol.Resize(numbersol);

    for (int64_t is=0; is<numbersol; is++)
    {
        data.sol[is].Resize(dim*nstate);
        data.sol[is].Fill(0);
        data.dsol[is].Redim(dim*nstate, dim);
        data.divsol[is].Resize(nstate);
        data.divsol[is].Fill(0.);
    }


    TPZFMatrix<TVar> GradOfPhiHdiv(dim,dim);
    GradOfPhiHdiv.Zero();


    int normvecRows = data.fDeformedDirections.Rows();
    int normvecCols = data.fDeformedDirections.Cols();
    TPZFNMatrix<3,REAL> Normalvec(normvecRows,normvecCols,0.);
    TPZManVector<TPZFNMatrix<9,REAL>,18> GradNormalvec(normvecCols);
    for (int i=0; i<GradNormalvec.size(); i++) {
        GradNormalvec[i].Redim(dim,dim);
    }

    if (data.fNeedsDeformedDirectionsFad) {
        // Needs to be rethought
        DebugStop();
        for (int e = 0; e < normvecRows; e++) {
            for (int s = 0; s < normvecCols; s++) {
                Normalvec(e,s)=data.fDeformedDirectionsFad(e,s).val();
            }
        }

        TPZFNMatrix<4,REAL> Grad0(3,3,0.);
        TPZGeoEl *ref = this->Reference();
        const int gel_dim = ref->Dimension();

        for (int s = 0; s < normvecCols; s++) {
            for (int i = 0; i < gel_dim; i++) {
                for (int j = 0; j < gel_dim; j++) {
                    Grad0(i,j)=data.fDeformedDirectionsFad(i,s).fastAccessDx(j);
                }
            }
            GradNormalvec[s] = Grad0;
        }

    }else{
        Normalvec=data.fDeformedDirections;
    }

    TPZBlock &block =this->Mesh()->Block();
    int ishape=0,ivec=0,counter=0;

    int nshapeV = data.fVecShapeIndex.NElements();

    for(int in=0; in<ncon; in++)
    {
        TPZConnect *df = &this->Connect(in);
        int64_t dfseq = df->SequenceNumber();
        int dfvar = block.Size(dfseq);
        // pos : position of the block in the solution matrix
        int64_t pos = block.Position(dfseq);

        /// ish loops of the number of shape functions associated with the block
        for(int ish=0; ish<dfvar/nstate; ish++)
        {
            for (int64_t is=0; is<numbersol; is++)
            {
                for(int idf=0; idf<nstate; idf++)
                {
                    TVar meshsol = MeshSol(pos+ish*nstate+idf,is);
                    REAL phival = data.phi(ishape,0);
                    TPZManVector<REAL,3> normal(3);

                    for (int i=0; i<3; i++)
                    {
                        if (data.fNeedsDeformedDirectionsFad) {
                            normal[i] = data.fDeformedDirectionsFad(i,ivec).val();
                        }else{
                            normal[i] = data.fDeformedDirections(i,ivec);
                        }
                    }

#ifdef PZ_LOG
                    if(logger.isDebugEnabled() && abs(meshsol) > 1.e-6)
                    {
                        std::stringstream sout;
                        sout << "meshsol = " << meshsol << " ivec " << ivec << " ishape " << ishape << " x " << data.x << std::endl;
                        sout << " phi = " << data.phi(ishape,0)  << std::endl;
                        sout << "normal = " << normal << std::endl;
//                        sout << "GradOfPhiHdiv " << GradOfPhiHdiv << std::endl;
                        sout << "GradNormalVec " << GradNormalvec[ivec] << std::endl;
                        LOGPZ_DEBUG(logger,sout.str())
                    }
#endif

                    data.divsol[is][idf] += data.divphi(counter,0)*meshsol;
                    for (int ilinha=0; ilinha<dim; ilinha++) {
                        data.sol[is][ilinha+dim*idf] += normal[ilinha]*phival*meshsol;
                        for (int kdim = 0 ; kdim < dim; kdim++) {
                            data.dsol[is](ilinha+dim*idf,kdim)+= meshsol * GradOfPhiHdiv(ilinha,kdim);
                            if(data.fNeedsDeformedDirectionsFad){
                                data.dsol[is](ilinha+dim*idf,kdim)+=meshsol *GradNormalvec[ivec](ilinha,kdim)*data.phi(ishape,0);
                            }
                        }

                    }

                }
            }
            counter++;
            ivec++;
            ishape++;
        }
    }






#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "x " << data.x << " sol " << data.sol[0] << std::endl;
        data.dsol[0].Print("dsol",sout);
        sout << "divsol" << data.divsol[0] << std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif

}